

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O1

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createTestQuadMosaic
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,VkImageViewType viewType)

{
  int iVar1;
  float *pfVar2;
  pointer pVVar3;
  int quadNdx;
  long lVar4;
  long lVar5;
  long lVar6;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> vertices;
  vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(viewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_2D:
    createFullscreenQuad();
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    createQuadMosaic(&local_28,2,3);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
    _M_move_assign(__return_storage_ptr__,&local_28);
    if (local_28.
        super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.
                      super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_28.
                            super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.
                            super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pVVar3 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(__return_storage_ptr__->
                  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3;
    if (lVar4 == 0) {
      return __return_storage_ptr__;
    }
    lVar4 = lVar4 >> 5;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    pfVar2 = (pVVar3->texCoord).m_data + 2;
    do {
      *pfVar2 = *pfVar2 / 5.0 + -0.001;
      pfVar2 = pfVar2 + 8;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    return __return_storage_ptr__;
  case VK_IMAGE_VIEW_TYPE_CUBE:
    createQuadMosaicCube();
    break;
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    createQuadMosaic(&local_28,2,3);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
    _M_move_assign(__return_storage_ptr__,&local_28);
    if (local_28.
        super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.
                      super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_28.
                            super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.
                            super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pVVar3 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      lVar5 = 0x14;
      do {
        *(float *)((long)(pVVar3->position).m_data + lVar5) = (float)lVar4;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0xd4);
      lVar4 = lVar4 + 1;
      pVVar3 = pVVar3 + 6;
    } while (lVar4 != 6);
    return __return_storage_ptr__;
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    createQuadMosaic(&local_28,2,3);
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    createQuadMosaicCube();
    lVar4 = 0;
    pVVar3 = local_28.
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar1 = (&DAT_00adbbe0)[lVar4];
      lVar5 = 0;
      do {
        lVar6 = lVar5;
        *(float *)((long)(pVVar3->texCoord).m_data + lVar6 + 0xc) = (float)iVar1;
        lVar5 = lVar6 + 0x20;
      } while ((int)(lVar6 + 0x20) != 0xc0);
      lVar4 = lVar4 + 1;
      pVVar3 = (pointer)((long)pVVar3[1].position.m_data + lVar6);
    } while (lVar4 != 6);
    break;
  default:
    goto switchD_00479fc4_default;
  }
  std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
  _M_move_assign(__return_storage_ptr__,&local_28);
  if (local_28.
      super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
switchD_00479fc4_default:
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createTestQuadMosaic (vk::VkImageViewType viewType)
{
	std::vector<Vertex4Tex4> vertices;

	switch (viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_2D:
			vertices = createFullscreenQuad();
			break;

		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			vertices = createQuadMosaic(2, 3);

			// Set up array indices
			for (size_t quadNdx = 0; quadNdx < 6; quadNdx++)
				for (size_t vertexNdx = 0; vertexNdx < 6; vertexNdx++)
					vertices[quadNdx * 6 + vertexNdx].texCoord.y() = (float)quadNdx;

			break;

		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			vertices = createQuadMosaic(2, 3);
			break;

		case vk::VK_IMAGE_VIEW_TYPE_3D:
			vertices = createQuadMosaic(2, 3);

			// Use z between 0.0 and 1.0.
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
			{
				vertices[vertexNdx].texCoord.z() /= 5.0f;
				vertices[vertexNdx].texCoord.z() -= 0.001f; // Substract small value to correct floating-point errors at the boundaries between slices
			}

			break;

		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
			vertices = createQuadMosaicCube();
			break;

		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			{
				int faceArrayIndices[6] = { 0, 1, 2, 3, 4, 5 };
				vertices = createQuadMosaicCubeArray(faceArrayIndices);
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return vertices;
}